

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O2

void __thiscall dlib::drawable_window::paint(drawable_window *this,canvas *c)

{
  kernel_1a_c *this_00;
  unsigned_long uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  map_pair<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>_>
  *pmVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar7;
  
  this->event_id = this->event_id + 1;
  canvas::fill(c,(this->bg_color).red,(this->bg_color).green,(this->bg_color).blue);
  this_00 = &this->widgets;
  (this->widgets).
  super_binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
  .at_start_ = true;
  (this->widgets).
  super_binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
  .stack_pos = '\0';
  (this->widgets).
  super_binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
  .current_element = (node *)0x0;
  while( true ) {
    bVar2 = binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
            ::move_next(&this_00->
                         super_binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
                       );
    if (!bVar2) break;
    pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
             ::element(this_00);
    iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
              ((long *)CONCAT44(extraout_var,iVar4));
    while( true ) {
      pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
               ::element(this_00);
      iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar4));
      if (cVar3 == '\0') break;
      pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
               ::element(this_00);
      iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x30))
                                 ((long *)CONCAT44(extraout_var_01,iVar4));
      if (*(char *)(*plVar6 + 0x38) == '\0') {
        pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                 ::element(this_00);
        iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
        plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x30))
                                   ((long *)CONCAT44(extraout_var_02,iVar4));
        uVar1 = this->event_id;
        if (*(unsigned_long *)(*plVar6 + 0x78) != uVar1) {
          pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                   ::element(this_00);
          iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
          plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x30))
                                     ((long *)CONCAT44(extraout_var_03,iVar4));
          *(unsigned_long *)(*plVar6 + 0x78) = uVar1;
          pmVar5 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                   ::element(this_00);
          iVar4 = (*pmVar5->_vptr_map_pair[4])(pmVar5);
          puVar7 = (undefined8 *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x30))
                             ((long *)CONCAT44(extraout_var_04,iVar4));
          (**(code **)(*(long *)*puVar7 + 0x50))((long *)*puVar7,c);
        }
      }
    }
  }
  return;
}

Assistant:

void drawable_window::
    paint (
        const canvas& c
    )
    {
        ++event_id;
        c.fill(bg_color.red,bg_color.green,bg_color.blue);

        widgets.reset();
        while (widgets.move_next())
        {
            widgets.element().value().reset();
            while (widgets.element().value().move_next())
            {
                // only dispatch a draw() call if this widget isn't hidden
                if (widgets.element().value().element()->hidden == false &&
                    widgets.element().value().element()->event_id != event_id)
                {
                    widgets.element().value().element()->event_id = event_id;
                    widgets.element().value().element()->draw(c);
                }
            }
        }
    }